

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O1

void AddSingleSector(plane *scrollplane,sector_t_conflict *sector,int movetype)

{
  FLinkedSector *pFVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  FLinkedSector *pFVar5;
  FLinkedSector *pFVar6;
  bool bVar7;
  
  uVar3 = (scrollplane->Sectors).Count;
  bVar7 = uVar3 != 0;
  if (bVar7) {
    pFVar5 = (scrollplane->Sectors).Array;
    if (pFVar5->Sector != sector) {
      uVar4 = 0;
      pFVar6 = pFVar5;
      do {
        if (uVar3 - 1 == uVar4) goto LAB_00402322;
        pFVar5 = pFVar6 + 1;
        uVar4 = uVar4 + 1;
        pFVar1 = pFVar6 + 1;
        pFVar6 = pFVar5;
      } while (pFVar1->Sector != sector);
      bVar7 = uVar4 < uVar3;
    }
    if ((movetype & 5U) != 0) {
      *(byte *)&pFVar5->Type = (byte)pFVar5->Type & 0xfa;
    }
    if ((movetype & 10U) != 0) {
      *(byte *)&pFVar5->Type = (byte)pFVar5->Type & 0xf5;
    }
    pFVar5->Type = pFVar5->Type | movetype;
    if (bVar7) {
      return;
    }
  }
LAB_00402322:
  TArray<FLinkedSector,_FLinkedSector>::Grow(&scrollplane->Sectors,1);
  pFVar5 = (scrollplane->Sectors).Array;
  uVar3 = (scrollplane->Sectors).Count;
  pFVar5[uVar3].Sector = sector;
  pFVar5[uVar3].Type = movetype;
  puVar2 = &(scrollplane->Sectors).Count;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

static void AddSingleSector(extsector_t::linked::plane &scrollplane, sector_t *sector, int movetype)
{
	// First we have to check the list if the sector is already in it
	// If so the move type must be adjusted

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Sector == sector)
		{
			if (movetype & LINK_FLOORBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_FLOORBITS;
			}

			if (movetype & LINK_CEILINGBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_CEILINGBITS;
			}

			scrollplane.Sectors[i].Type |= movetype;
			return;
		}
	}

	// The sector hasn't been attached yet so do it now

	FLinkedSector newlink = {sector, movetype};
	scrollplane.Sectors.Push(newlink);
}